

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O2

void __thiscall
HighsHashTable<MatrixColumn,_int>::makeEmptyTable
          (HighsHashTable<MatrixColumn,_int> *this,u64 capacity)

{
  ulong uVar1;
  pointer __p_1;
  pointer __p_00;
  pointer __p_01;
  pointer __p;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_28;
  
  this->tableSizeMask = capacity - 1;
  uVar1 = 0x3f;
  if (capacity != 0) {
    for (; capacity >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  this->numHashShift = ~uVar1 + 0x41;
  this->numElements = 0;
  __p_00 = (pointer)operator_new__(capacity);
  memset(__p_00,0,capacity);
  local_28._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)0x0;
  std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
            ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)
             &this->metadata,__p_00);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_28);
  __p_01 = (pointer)operator_new(capacity * 0x18);
  local_28._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)0x0;
  std::
  __uniq_ptr_impl<HighsHashTableEntry<MatrixColumn,_int>,_HighsHashTable<MatrixColumn,_int>::OpNewDeleter>
  ::reset((__uniq_ptr_impl<HighsHashTableEntry<MatrixColumn,_int>,_HighsHashTable<MatrixColumn,_int>::OpNewDeleter>
           *)this,__p_01);
  std::
  unique_ptr<HighsHashTableEntry<MatrixColumn,_int>,_HighsHashTable<MatrixColumn,_int>::OpNewDeleter>
  ::~unique_ptr((unique_ptr<HighsHashTableEntry<MatrixColumn,_int>,_HighsHashTable<MatrixColumn,_int>::OpNewDeleter>
                 *)&local_28);
  return;
}

Assistant:

void makeEmptyTable(u64 capacity) {
    tableSizeMask = capacity - 1;
    numHashShift = 64 - HighsHashHelpers::log2i(capacity);
    assert(capacity == (u64{1} << (64 - numHashShift)));
    numElements = 0;

    metadata = decltype(metadata)(new u8[capacity]{});
    entries =
        decltype(entries)((Entry*)::operator new(sizeof(Entry) * capacity));
  }